

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void pcache1PinPage(PgHdr1 *pPage)

{
  uint *puVar1;
  PCache1 *pPVar2;
  PGroup *pPVar3;
  PgHdr1 *pPVar4;
  PgHdr1 *pPVar5;
  
  if (pPage != (PgHdr1 *)0x0) {
    pPVar2 = pPage->pCache;
    pPVar5 = pPage->pLruNext;
    pPVar3 = pPVar2->pGroup;
    if ((pPVar5 != (PgHdr1 *)0x0) || (pPVar3->pLruTail == pPage)) {
      pPVar4 = pPage->pLruPrev;
      if (pPVar4 != (PgHdr1 *)0x0) {
        pPVar4->pLruNext = pPVar5;
        pPVar5 = pPage->pLruNext;
      }
      if (pPVar5 != (PgHdr1 *)0x0) {
        pPVar5->pLruPrev = pPVar4;
      }
      if (pPVar3->pLruHead == pPage) {
        pPVar3->pLruHead = pPVar5;
      }
      if (pPVar3->pLruTail == pPage) {
        pPVar3->pLruTail = pPage->pLruPrev;
      }
      pPage->pLruNext = (PgHdr1 *)0x0;
      pPage->pLruPrev = (PgHdr1 *)0x0;
      puVar1 = &pPVar2->nRecyclable;
      *puVar1 = *puVar1 - 1;
      return;
    }
  }
  return;
}

Assistant:

static void pcache1PinPage(PgHdr1 *pPage){
  PCache1 *pCache;
  PGroup *pGroup;

  if( pPage==0 ) return;
  pCache = pPage->pCache;
  pGroup = pCache->pGroup;
  assert( sqlite3_mutex_held(pGroup->mutex) );
  if( pPage->pLruNext || pPage==pGroup->pLruTail ){
    if( pPage->pLruPrev ){
      pPage->pLruPrev->pLruNext = pPage->pLruNext;
    }
    if( pPage->pLruNext ){
      pPage->pLruNext->pLruPrev = pPage->pLruPrev;
    }
    if( pGroup->pLruHead==pPage ){
      pGroup->pLruHead = pPage->pLruNext;
    }
    if( pGroup->pLruTail==pPage ){
      pGroup->pLruTail = pPage->pLruPrev;
    }
    pPage->pLruNext = 0;
    pPage->pLruPrev = 0;
    pPage->pCache->nRecyclable--;
  }
}